

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O0

void free_postfix_subexpr(gvisitor_t *self,gnode_postfix_subexpr_t *subnode)

{
  gnode_t *local_48;
  gnode_t *local_40;
  gnode_t *val;
  size_t _i;
  size_t _len;
  gnode_n tag;
  gnode_postfix_subexpr_t *subnode_local;
  gvisitor_t *self_local;
  
  if ((subnode->base).refcount == 0) {
    if ((subnode->base).tag == NODE_CALL_EXPR) {
      if ((subnode->field_1).expr != (gnode_t *)0x0) {
        if ((subnode->field_1).expr == (gnode_t *)0x0) {
          local_40 = (gnode_t *)0x0;
        }
        else {
          local_40 = (gnode_t *)((subnode->field_1).args)->n;
        }
        for (val = (gnode_t *)0x0; val < local_40; val = (gnode_t *)((long)&val->tag + 1)) {
          if (val < (gnode_t *)((subnode->field_1).args)->n) {
            local_48 = ((subnode->field_1).args)->p[(long)val];
          }
          else {
            local_48 = (gnode_t *)0x0;
          }
          gvisit(self,local_48);
        }
        if (((subnode->field_1).args)->p != (gnode_t **)0x0) {
          free(((subnode->field_1).args)->p);
        }
        free((subnode->field_1).expr);
      }
    }
    else {
      gvisit(self,(subnode->field_1).expr);
    }
    free(subnode);
  }
  else {
    (subnode->base).refcount = (subnode->base).refcount - 1;
  }
  return;
}

Assistant:

static void free_postfix_subexpr (gvisitor_t *self, gnode_postfix_subexpr_t *subnode) {
    CHECK_REFCOUNT(subnode);

    gnode_n tag = subnode->base.tag;
    if (tag == NODE_CALL_EXPR) {
        if (subnode->args) {
            gnode_array_each(subnode->args, visit(val););
            gnode_array_free(subnode->args);
        }
    } else {
        visit(subnode->expr);
    }

    mem_free((gnode_t*)subnode);
}